

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInputSource.cc
# Opt level: O2

ssize_t __thiscall FileInputSource::read(FileInputSource *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  qpdf_offset_t qVar2;
  size_t sVar3;
  undefined4 extraout_var;
  QPDFExc *this_00;
  undefined4 in_register_00000034;
  allocator<char> local_ca;
  allocator<char> local_c9;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  qVar2 = QUtil::tell(this->file);
  (this->super_InputSource).last_offset = qVar2;
  sVar3 = fread((void *)CONCAT44(in_register_00000034,__fd),1,(size_t)__buf,(FILE *)this->file);
  if (sVar3 == 0) {
    iVar1 = ferror((FILE *)this->file);
    if (iVar1 != 0) {
      this_00 = (QPDFExc *)__cxa_allocate_exception(0x80);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_c9);
      qVar2 = (this->super_InputSource).last_offset;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"read ",&local_ca);
      std::__cxx11::to_string(&local_c8,(unsigned_long)__buf);
      std::operator+(&local_88,&local_a8,&local_c8);
      std::operator+(&local_68,&local_88," bytes");
      QPDFExc::QPDFExc(this_00,qpdf_e_system,&this->filename,&local_48,qVar2,&local_68);
      __cxa_throw(this_00,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    if (__buf != (void *)0x0) {
      (*(this->super_InputSource)._vptr_InputSource[5])(this,0,2);
      iVar1 = (*(this->super_InputSource)._vptr_InputSource[4])(this);
      (this->super_InputSource).last_offset = CONCAT44(extraout_var,iVar1);
    }
  }
  return sVar3;
}

Assistant:

size_t
FileInputSource::read(char* buffer, size_t length)
{
    this->last_offset = QUtil::tell(this->file);
    size_t len = fread(buffer, 1, length, this->file);
    if (len == 0) {
        if (ferror(this->file)) {
            throw QPDFExc(
                qpdf_e_system,
                this->filename,
                "",
                this->last_offset,
                (std::string("read ") + std::to_string(length) + " bytes"));
        } else if (length > 0) {
            this->seek(0, SEEK_END);
            this->last_offset = this->tell();
        }
    }
    return len;
}